

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceTable(U32 *table,U32 size,U32 reducerValue)

{
  U32 reducerValue_local;
  U32 size_local;
  U32 *table_local;
  U32 adder;
  int column;
  int rowNb;
  int cellNb;
  int nbRows;
  
  cellNb = 0;
  for (rowNb = 0; rowNb < (int)size / 0x10; rowNb = rowNb + 1) {
    for (column = 0; column < 0x10; column = column + 1) {
      if (table[cellNb] < reducerValue) {
        table[cellNb] = 0;
      }
      else {
        table[cellNb] = table[cellNb] - reducerValue;
      }
      cellNb = cellNb + 1;
    }
  }
  return;
}

Assistant:

static void ZSTD_reduceTable(U32* const table, U32 const size, U32 const reducerValue)
{
    ZSTD_reduceTable_internal(table, size, reducerValue, 0);
}